

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_nameMatchesAscii(ENCODING *enc,char *ptr1,char *end1,char *ptr2)

{
  char *local_30;
  char *ptr2_local;
  char *end1_local;
  char *ptr1_local;
  ENCODING *enc_local;
  
  local_30 = ptr2;
  end1_local = ptr1;
  while( true ) {
    if (*local_30 == '\0') {
      return (uint)(end1_local == end1);
    }
    if (end1_local == end1) break;
    if ((*end1_local != '\0') || (end1_local[1] != *local_30)) {
      return 0;
    }
    end1_local = end1_local + 2;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

static
int PREFIX(nameMatchesAscii)(const ENCODING *enc, const char *ptr1,
                             const char *end1, const char *ptr2)
{
  cmExpatUnused(enc);
  for (; *ptr2; ptr1 += MINBPC(enc), ptr2++) {
    if (ptr1 == end1)
      return 0;
    if (!CHAR_MATCHES(enc, ptr1, *ptr2))
      return 0;
  }
  return ptr1 == end1;
}